

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptConstructor(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  TIntermTyped *pTVar2;
  TIntermTyped *local_d0;
  TIntermTyped *arguments;
  TFunction *local_c0;
  TFunction *constructorFunction;
  TType type;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  type.spirvType = (TSpirvType *)node;
  TType::TType((TType *)&constructorFunction,EbtVoid,EvqTemporary,1,0,0,false);
  bVar1 = acceptType(this,(TType *)&constructorFunction);
  if (bVar1) {
    local_c0 = HlslParseContext::makeConstructorCall
                         (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                          (TType *)&constructorFunction);
    if (local_c0 == (TFunction *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      local_d0 = (TIntermTyped *)0x0;
      bVar1 = acceptArguments(this,local_c0,&local_d0);
      if (bVar1) {
        if (local_d0 == (TIntermTyped *)0x0) {
          expected(this,"one or more arguments");
          this_local._7_1_ = false;
        }
        else {
          pTVar2 = HlslParseContext::handleFunctionCall
                             (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_c0,
                              local_d0);
          ((type.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator =
               (TPoolAllocator *)pTVar2;
          this_local._7_1_ =
               ((type.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator !=
               (TPoolAllocator *)0x0;
        }
      }
      else {
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  arguments._4_4_ = 1;
  TType::~TType((TType *)&constructorFunction);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptConstructor(TIntermTyped*& node)
{
    // type
    TType type;
    if (acceptType(type)) {
        TFunction* constructorFunction = parseContext.makeConstructorCall(token.loc, type);
        if (constructorFunction == nullptr)
            return false;

        // arguments
        TIntermTyped* arguments = nullptr;
        if (! acceptArguments(constructorFunction, arguments)) {
            // It's possible this is a type keyword used as an identifier.  Put the token back
            // for later use.
            recedeToken();
            return false;
        }

        if (arguments == nullptr) {
            expected("one or more arguments");
            return false;
        }

        // hook it up
        node = parseContext.handleFunctionCall(token.loc, constructorFunction, arguments);

        return node != nullptr;
    }

    return false;
}